

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

string * __thiscall Edge::GetUnescapedRspfile_abi_cxx11_(string *__return_storage_ptr__,Edge *this)

{
  EdgeEnv env;
  string local_70;
  EdgeEnv local_50;
  
  local_50.super_Env._vptr_Env = (_func_int **)&PTR__EdgeEnv_001fdad8;
  local_50.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.escape_in_out_ = kDoNotEscape;
  local_50.recursive_ = false;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50.edge_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rspfile","");
  EdgeEnv::LookupVariable(__return_storage_ptr__,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50.super_Env._vptr_Env = (_func_int **)&PTR__EdgeEnv_001fdad8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50.lookups_);
  return __return_storage_ptr__;
}

Assistant:

std::string Edge::GetUnescapedRspfile() const {
  EdgeEnv env(this, EdgeEnv::kDoNotEscape);
  return env.LookupVariable("rspfile");
}